

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_symbol_table.c
# Opt level: O3

boolean l2_symbol_table_add_symbol_real(l2_symbol_node **head_p,char *symbol_name,double real)

{
  _l2_symbol_node **pp_Var1;
  int iVar2;
  _l2_symbol_node *p_Var3;
  l2_symbol_node *plVar4;
  l2_symbol_node *plVar5;
  
  plVar4 = *head_p;
  p_Var3 = plVar4;
  if (plVar4 == (l2_symbol_node *)0x0) {
    plVar4 = (l2_symbol_node *)l2_storage_mem_new_with_zero(g_parser_p->storage_p,0x28);
    *head_p = plVar4;
    plVar4->next = (_l2_symbol_node *)0x0;
    ((*head_p)->symbol).symbol_name = symbol_name;
    p_Var3 = *head_p;
  }
  else {
    do {
      iVar2 = strcmp(symbol_name,(p_Var3->symbol).symbol_name);
      if (iVar2 == 0) {
        return '\0';
      }
      pp_Var1 = &p_Var3->next;
      p_Var3 = *pp_Var1;
    } while (*pp_Var1 != (_l2_symbol_node *)0x0);
    do {
      plVar5 = plVar4;
      plVar4 = plVar5->next;
    } while (plVar5->next != (_l2_symbol_node *)0x0);
    p_Var3 = (_l2_symbol_node *)l2_storage_mem_new_with_zero(g_parser_p->storage_p,0x28);
    plVar5->next = p_Var3;
    p_Var3->next = (_l2_symbol_node *)0x0;
    p_Var3 = plVar5->next;
    (p_Var3->symbol).symbol_name = symbol_name;
  }
  (p_Var3->symbol).type = L2_SYMBOL_TYPE_REAL;
  (p_Var3->symbol).u.real = real;
  return '\x01';
}

Assistant:

boolean l2_symbol_table_add_symbol_real(l2_symbol_node **head_p, char *symbol_name, double real) {

    /* judge the symbol if already defined before */
    if (l2_symbol_table_get_symbol_node_by_name_in_symbol_table(*head_p, symbol_name) != L2_NULL_PTR) return L2_FALSE;
    l2_symbol_node *current_p = *head_p;

    if (*head_p == L2_NULL_PTR) {
        *head_p = l2_storage_mem_new_with_zero(g_parser_p->storage_p, sizeof(l2_symbol_node));
        (*head_p)->next = L2_NULL_PTR;
        (*head_p)->symbol.symbol_name = symbol_name;
        (*head_p)->symbol.type = L2_SYMBOL_TYPE_REAL;
        (*head_p)->symbol.u.real = real;
        return L2_TRUE;
    }

    while (current_p->next) {
        current_p = current_p->next;
    }
    current_p->next = l2_storage_mem_new_with_zero(g_parser_p->storage_p, sizeof(l2_symbol_node));
    current_p->next->next = L2_NULL_PTR;
    current_p->next->symbol.symbol_name = symbol_name;
    current_p->next->symbol.type = L2_SYMBOL_TYPE_REAL;
    current_p->next->symbol.u.real = real;
    return L2_TRUE;
}